

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::PortPackedVisitor::visit(PortPackedVisitor *this,Generator *generator)

{
  bool bVar1;
  uint uVar2;
  VarType VVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *struct_def_00;
  element_type *var_00;
  shared_ptr<kratos::PackedStruct> local_c8;
  undefined1 local_b8 [8];
  shared_ptr<kratos::VarPackedStruct> ptr_1;
  undefined1 local_98 [8];
  shared_ptr<kratos::PortPackedStruct> ptr;
  shared_ptr<kratos::PackedStruct> struct_def;
  undefined1 local_68 [8];
  shared_ptr<kratos::Var> var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *var_names;
  Generator *generator_local;
  PortPackedVisitor *this_local;
  
  var_names = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)generator;
  generator_local = (Generator *)this;
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2,generator);
  local_20 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  var_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&var_name), bVar1) {
    var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    Generator::get_var((Generator *)local_68,(string *)var_names);
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    uVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[0x17])();
    if ((uVar2 & 1) != 0) {
      std::shared_ptr<kratos::PackedStruct>::shared_ptr
                ((shared_ptr<kratos::PackedStruct> *)
                 &ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
      VVar3 = Var::type(peVar4);
      if (VVar3 == PortIO) {
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_68);
        Var::as<kratos::PortPackedStruct>((Var *)local_98);
        peVar5 = std::
                 __shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
        (*(peVar5->super_Port).super_Var.super_IRNode._vptr_IRNode[0x2e])
                  (&ptr_1.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<kratos::PackedStruct>::operator=
                  ((shared_ptr<kratos::PackedStruct> *)
                   &ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (shared_ptr<kratos::PackedStruct> *)
                   &ptr_1.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PackedStruct> *)
                   &ptr_1.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<kratos::PortPackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::PortPackedStruct> *)local_98);
      }
      else {
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_68);
        Var::as<kratos::VarPackedStruct>((Var *)local_b8);
        peVar6 = std::
                 __shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b8);
        (*(peVar6->super_Var).super_IRNode._vptr_IRNode[0x2d])(&local_c8);
        std::shared_ptr<kratos::PackedStruct>::operator=
                  ((shared_ptr<kratos::PackedStruct> *)
                   &ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&local_c8);
        std::shared_ptr<kratos::PackedStruct>::~shared_ptr(&local_c8);
        std::shared_ptr<kratos::VarPackedStruct>::~shared_ptr
                  ((shared_ptr<kratos::VarPackedStruct> *)local_b8);
      }
      peVar7 = std::
               __shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ptr.
                              super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      if ((peVar7->external & 1U) == 0) {
        struct_def_00 =
             std::__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> *)
                        &ptr.
                         super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
        var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_68);
        process_struct_(this,struct_def_00,var_00);
      }
      std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                ((shared_ptr<kratos::PackedStruct> *)
                 &ptr.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            if (var->is_struct()) {
                std::shared_ptr<PackedStruct> struct_def;
                if (var->type() == VarType::PortIO) {
                    auto ptr = var->as<PortPackedStruct>();
                    struct_def = ptr->packed_struct();
                } else {
                    auto ptr = var->as<VarPackedStruct>();
                    struct_def = ptr->packed_struct();
                }
                if (struct_def->external) continue;
                process_struct_(struct_def.get(), var.get());
            }
        }
    }